

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O2

bool re2::Regexp::SimplifyRegexp(StringPiece *src,ParseFlags flags,string *dst,RegexpStatus *status)

{
  Regexp *this;
  Regexp *this_00;
  ostream *o;
  LogMessage LStack_1a8;
  
  this = Parse(src,flags,status);
  if (this != (Regexp *)0x0) {
    this_00 = Simplify(this);
    Decref(this);
    if (this_00 != (Regexp *)0x0) {
      ToString_abi_cxx11_((string *)&LStack_1a8,this_00);
      std::__cxx11::string::operator=((string *)dst,(string *)&LStack_1a8);
      std::__cxx11::string::~string((string *)&LStack_1a8);
      Decref(this_00);
      return true;
    }
    LogMessage::LogMessage
              (&LStack_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/simplify.cc",
               0x1c,2);
    o = std::operator<<((ostream *)&LStack_1a8.str_,"Simplify failed on ");
    operator<<(o,src);
    LogMessage::~LogMessage(&LStack_1a8);
    if (status != (RegexpStatus *)0x0) {
      status->code_ = kRegexpInternalError;
      (status->error_arg_).ptr_ = src->ptr_;
      (status->error_arg_).length_ = src->length_;
    }
  }
  return false;
}

Assistant:

bool Regexp::SimplifyRegexp(const StringPiece& src, ParseFlags flags,
                            string* dst,
                            RegexpStatus* status) {
  Regexp* re = Parse(src, flags, status);
  if (re == NULL)
    return false;
  Regexp* sre = re->Simplify();
  re->Decref();
  if (sre == NULL) {
    // Should not happen, since Simplify never fails.
    LOG(ERROR) << "Simplify failed on " << src;
    if (status) {
      status->set_code(kRegexpInternalError);
      status->set_error_arg(src);
    }
    return false;
  }
  *dst = sre->ToString();
  sre->Decref();
  return true;
}